

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::ClassSpecifierSyntax*>::
emplace_back<slang::syntax::ClassSpecifierSyntax*>
          (SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*> *this,ClassSpecifierSyntax **args)

{
  iterator ppCVar1;
  undefined8 *in_RSI;
  SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*> *in_RDI;
  ClassSpecifierSyntax **in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::end(in_RDI);
    local_8 = emplaceRealloc<slang::syntax::ClassSpecifierSyntax*>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    ppCVar1 = SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::end(in_RDI);
    *ppCVar1 = (ClassSpecifierSyntax *)*in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<slang::syntax::ClassSpecifierSyntax_*>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }